

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O3

size_t __thiscall avro::GenericRecord::fieldIndex(GenericRecord *this,string *name)

{
  char cVar1;
  undefined8 *puVar2;
  size_t index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  cVar1 = (**(code **)(**(long **)this + 0x48))();
  if (cVar1 != '\0') {
    return 0;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x18);
  std::operator+(&local_38,"Invalid field name: ",name);
  std::runtime_error::runtime_error((runtime_error *)(puVar2 + 1),(string *)&local_38);
  *puVar2 = 0x1b90f0;
  puVar2[1] = 0x1b9120;
  __cxa_throw(puVar2,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

size_t fieldIndex(const std::string& name) const { 
        size_t index = 0;
        if (!schema()->nameIndex(name, index)) {
            throw Exception("Invalid field name: " + name);
        }
        return index;
    }